

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# carver.cpp
# Opt level: O3

vector<int,_std::allocator<int>_> * __thiscall
carver::Carver::calculateLowestEnergyPath
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,Carver *this,Mat *source)

{
  bool bVar1;
  int iVar2;
  _InputArray *p_Var3;
  ulong uVar4;
  long lVar5;
  uint uVar6;
  Carver *this_00;
  ulong uVar7;
  value_type_conflict2 *__val;
  Point minIdxPoint;
  Mat lastRow;
  vector<double,_std::allocator<double>_> local_e8;
  uint local_d0 [2];
  void *local_c8 [2];
  long local_b8;
  _InputArray local_b0;
  Range local_98;
  allocator_type local_90 [96];
  
  std::vector<int,_std::allocator<int>_>::vector
            (__return_storage_ptr__,(long)*(int *)(source + 8),local_90);
  local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)operator_new(0x18);
  local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start + 3;
  local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start[2] = 0.0;
  *local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
   _M_start = 0.0;
  local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start[1] = 0.0;
  local_d0[0] = 0;
  local_d0[1] = 0;
  local_b0._4_4_ = *(undefined4 *)(source + 8);
  local_b0.flags = local_b0._4_4_ + -1;
  local_98.start = -0x80000000;
  local_98.end = 0x7fffffff;
  local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  cv::Mat::Mat((Mat *)local_90,source,(Range *)&local_b0,&local_98);
  local_b0.sz.width = 0;
  local_b0.sz.height = 0;
  local_b0.flags = 0x1010000;
  local_b0.obj = (Mat *)local_90;
  p_Var3 = (_InputArray *)cv::noArray();
  cv::minMaxLoc(&local_b0,(double *)0x0,(double *)0x0,(Point_ *)local_d0,(Point_ *)0x0,p_Var3);
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start[(long)*(int *)(source + 8) + -1] = local_d0[0];
  if (1 < *(int *)(source + 8)) {
    uVar7 = (ulong)(*(int *)(source + 8) - 2);
    uVar6 = local_d0[0];
    do {
      uVar4 = 1;
      if (1 < (int)uVar6) {
        uVar4 = (ulong)uVar6;
      }
      lVar5 = **(long **)(source + 0x48) * uVar7 + *(long *)(source + 0x10);
      *local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_start = *(double *)(lVar5 + -8 + uVar4 * 8);
      local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[1] = *(double *)(lVar5 + (long)(int)uVar6 * 8);
      iVar2 = *(int *)(source + 0xc) + -1;
      if ((int)(uVar6 + 1) <= *(int *)(source + 0xc) + -1) {
        iVar2 = uVar6 + 1;
      }
      local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[2] = *(double *)(lVar5 + (long)iVar2 * 8);
      this_00 = (Carver *)local_c8;
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)local_c8,&local_e8);
      iVar2 = findMinOffset_(this_00,(vector<double,_std::allocator<double>_> *)local_c8);
      if (local_c8[0] != (void *)0x0) {
        operator_delete(local_c8[0],local_b8 - (long)local_c8[0]);
      }
      uVar6 = iVar2 + uVar6;
      if ((int)uVar6 < 1) {
        uVar6 = 0;
      }
      if ((int)(*(int *)(source + 0xc) - 1U) < (int)uVar6) {
        uVar6 = *(int *)(source + 0xc) - 1U;
      }
      (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
      super__Vector_impl_data._M_start[uVar7] = uVar6;
      bVar1 = 0 < (long)uVar7;
      uVar7 = uVar7 - 1;
    } while (bVar1);
  }
  cv::Mat::~Mat((Mat *)local_90);
  if (local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<int> Carver::calculateLowestEnergyPath(cv::Mat &source) {
    vector<int> path(source.rows);
    vector<double> nextHops(3);
    int delta = 0;

    // Find the minimum of the last row, that is our starting point
    cv::Point minIdxPoint;
    int minIdx;
    cv::Mat lastRow = source.row(source.rows - 1);
    cv::minMaxLoc(lastRow, nullptr, nullptr, &minIdxPoint, nullptr);
    minIdx = minIdxPoint.x;
    path[source.rows - 1] = minIdx;

    for (int r = source.rows - 2; r >= 0; r--) {
        nextHops[0] = source.at<double>(r, max(minIdx - 1, 0));
        nextHops[1] = source.at<double>(r, minIdx);
        nextHops[2] = source.at<double>(r, min(minIdx + 1, source.cols - 1));

        delta = findMinOffset_(nextHops);

        // Add the discovered minimum index to our path, taking care
        // not to cross image boundaries
        minIdx += delta;
        minIdx = min(max(minIdx, 0), source.cols - 1);
        path[r] = minIdx;
    }

    return path;
}